

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listhead.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *in_RSI;
  int in_EDI;
  int ii;
  int nkeys;
  int hdupos;
  int single;
  int status;
  char card [81];
  fitsfile *fptr;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  int iVar3;
  fitsfile *in_stack_ffffffffffffff88;
  undefined4 local_18;
  int in_stack_ffffffffffffffec;
  int local_4;
  
  local_4 = 0;
  iVar3 = 0;
  if (in_EDI == 2) {
    iVar1 = ffopentest(0,(fitsfile **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c,(int *)0x106808);
    if (iVar1 == 0) {
      ffghdn((fitsfile *)CONCAT44(in_stack_ffffffffffffffec,local_18),
             (int *)&stack0xffffffffffffff7c);
      if ((in_stack_ffffffffffffff7c != 1) ||
         (pcVar2 = strchr(in_RSI->_IO_read_ptr,0x5b), pcVar2 != (char *)0x0)) {
        iVar3 = 1;
      }
      while (local_4 == 0) {
        ffghsp((fitsfile *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(int *)0x10687e)
        ;
        printf("Header listing for HDU #%d:\n",(ulong)in_stack_ffffffffffffff7c);
        in_stack_ffffffffffffff74 = 1;
        while ((in_stack_ffffffffffffff74 <= in_stack_ffffffffffffff78 &&
               (iVar1 = ffgrec((fitsfile *)
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                               in_stack_ffffffffffffff74,
                               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                               ,(int *)0x1068bd), iVar1 == 0))) {
          printf("%s\n",&stack0xffffffffffffff88);
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1;
        }
        printf("END\n\n");
        if (iVar3 != 0) break;
        ffmrhd(in_stack_ffffffffffffff88,local_4,
               (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1;
      }
      if (local_4 == 0x6b) {
        local_4 = 0;
      }
      ffclos((fitsfile *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    if (local_4 != 0) {
      ffrprt(in_RSI,in_stack_ffffffffffffffec);
    }
  }
  else {
    printf("Usage:  listhead filename[ext] \n");
    printf("\n");
    printf("List the FITS header keywords in a single extension, or, if \n");
    printf("ext is not given, list the keywords in all the extensions. \n");
    printf("\n");
    printf("Examples: \n");
    printf("   listhead file.fits      - list every header in the file \n");
    printf("   listhead file.fits[0]   - list primary array header \n");
    printf("   listhead file.fits[2]   - list header of 2nd extension \n");
    printf("   listhead file.fits+2    - same as above \n");
    printf("   listhead file.fits[GTI] - list header of GTI extension\n");
    printf("\n");
    printf("Note that it may be necessary to enclose the input file\n");
    printf("name in single quote characters on the Unix command line.\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    fitsfile *fptr;         /* FITS file pointer, defined in fitsio.h */
    char card[FLEN_CARD];   /* Standard string lengths defined in fitsio.h */
    int status = 0, single = 0, hdupos, nkeys, ii;

    if (argc != 2) {
      printf("Usage:  listhead filename[ext] \n");
      printf("\n");
      printf("List the FITS header keywords in a single extension, or, if \n");
      printf("ext is not given, list the keywords in all the extensions. \n");
      printf("\n");
      printf("Examples: \n");
      printf("   listhead file.fits      - list every header in the file \n");
      printf("   listhead file.fits[0]   - list primary array header \n");
      printf("   listhead file.fits[2]   - list header of 2nd extension \n");
      printf("   listhead file.fits+2    - same as above \n");
      printf("   listhead file.fits[GTI] - list header of GTI extension\n");
      printf("\n");
      printf("Note that it may be necessary to enclose the input file\n");
      printf("name in single quote characters on the Unix command line.\n");
      return(0);
    }

    if (!fits_open_file(&fptr, argv[1], READONLY, &status))
    {
      fits_get_hdu_num(fptr, &hdupos);  /* Get the current HDU position */

      /* List only a single header if a specific extension was given */ 
      if (hdupos != 1 || strchr(argv[1], '[')) single = 1;

      for (; !status; hdupos++)  /* Main loop through each extension */
      {
        fits_get_hdrspace(fptr, &nkeys, NULL, &status); /* get # of keywords */

        printf("Header listing for HDU #%d:\n", hdupos);

        for (ii = 1; ii <= nkeys; ii++) { /* Read and print each keywords */

           if (fits_read_record(fptr, ii, card, &status))break;
           printf("%s\n", card);
        }
        printf("END\n\n");  /* terminate listing with END */

        if (single) break;  /* quit if only listing a single header */

        fits_movrel_hdu(fptr, 1, NULL, &status);  /* try to move to next HDU */
      }

      if (status == END_OF_FILE)  status = 0; /* Reset after normal error */

      fits_close_file(fptr, &status);
    }

    if (status) fits_report_error(stderr, status); /* print any error message */
    return(status);
}